

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
DynamicHistogram<double>::pdf
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          DynamicHistogram<double> *this)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  runtime_error *this_00;
  reference pdVar5;
  reference pdVar6;
  double dVar7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  const_iterator freq;
  iterator dist;
  double sum;
  value_type_conflict3 local_30;
  undefined1 local_25;
  DynamicHistogram<double> *local_18;
  DynamicHistogram<double> *this_local;
  vector<double,_std::allocator<double>_> *prob;
  
  local_18 = this;
  this_local = (DynamicHistogram<double> *)__return_storage_ptr__;
  uVar3 = (*this->_vptr_DynamicHistogram[2])();
  if ((uVar3 & 1) != 0) {
    local_25 = 0;
    iVar4 = count_(this);
    local_30 = 0.0;
    std::allocator<double>::allocator((allocator<double> *)((long)&sum + 7));
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,(long)iVar4,&local_30,(allocator<double> *)((long)&sum + 7));
    std::allocator<double>::~allocator((allocator<double> *)((long)&sum + 7));
    dVar7 = total(this);
    freq._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
    local_58._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(&this->_frequencies);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_50,&local_58);
    while( true ) {
      local_60._M_current =
           (double *)std::vector<double,_std::allocator<double>_>::end(&this->_frequencies);
      bVar2 = __gnu_cxx::operator!=(&local_50,&local_60);
      if (!bVar2) break;
      pdVar5 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&local_50);
      dVar1 = *pdVar5;
      pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)&freq);
      *pdVar6 = dVar1 / dVar7;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)&freq
                 ,0);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_50);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"DynamicHistogram::pdf - Histogram could not be initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<double>
    pdf()
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::pdf - Histogram could not be initialized.");

        std::vector<double> prob(this->count_(),0);

        double sum = this->total();

        std::vector<double>::iterator dist = prob.begin();
        for (std::vector<double>::const_iterator freq = this->_frequencies.begin(); freq != this->_frequencies.end(); ++freq)
        {
            *dist = (*freq) / sum;
            dist++;
        }

        return prob;

    }